

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

QObjectList * __thiscall QObjectPrivate::receiverList(QObjectPrivate *this,char *signal)

{
  int iVar1;
  int iVar2;
  Type pCVar3;
  Type this_00;
  ConnectionList *this_01;
  Type pQVar4;
  char *in_RDX;
  QObjectPrivate *in_RSI;
  QObjectList *in_RDI;
  QObject *r;
  Connection *c;
  ConnectionData *cd;
  int signal_index;
  QObjectList *returnValue;
  parameter_type in_stack_ffffffffffffff78;
  ConnectionData *in_stack_ffffffffffffff80;
  Type local_48;
  undefined4 in_stack_ffffffffffffffe0;
  int i;
  uint3 in_stack_ffffffffffffffe4;
  uint uVar5;
  
  uVar5 = (uint)in_stack_ffffffffffffffe4;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  QList<QObject_*>::QList((QList<QObject_*> *)0x3eab26);
  iVar1 = signalIndex(in_RSI,in_RDX,(QMetaObject **)CONCAT44(uVar5,in_stack_ffffffffffffffe0));
  pCVar3 = QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadAcquire
                     ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x3eab55);
  if (((-1 < iVar1) && (pCVar3 != (Type)0x0)) &&
     (i = iVar1, iVar2 = ConnectionData::signalVectorCount(in_stack_ffffffffffffff80), iVar1 < iVar2
     )) {
    this_00 = QBasicAtomicPointer<QObjectPrivate::SignalVector>::loadRelaxed
                        ((QBasicAtomicPointer<QObjectPrivate::SignalVector> *)0x3eabce);
    this_01 = SignalVector::at(this_00,i);
    local_48 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                         ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3eabeb);
    while (local_48 != (Type)0x0) {
      pQVar4 = QBasicAtomicPointer<QObject>::loadRelaxed((QBasicAtomicPointer<QObject> *)0x3eac06);
      if (pQVar4 != (Type)0x0) {
        QList<QObject_*>::operator<<((QList<QObject_*> *)this_01,in_stack_ffffffffffffff78);
      }
      local_48 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                           ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3eac34);
    }
  }
  return in_RDI;
}

Assistant:

QObjectList QObjectPrivate::receiverList(const char *signal) const
{
    QObjectList returnValue;
    int signal_index = signalIndex(signal);
    ConnectionData *cd = connections.loadAcquire();
    if (signal_index < 0 || !cd)
        return returnValue;
    if (signal_index < cd->signalVectorCount()) {
        const QObjectPrivate::Connection *c = cd->signalVector.loadRelaxed()->at(signal_index).first.loadRelaxed();

        while (c) {
            QObject *r = c->receiver.loadRelaxed();
            if (r)
                returnValue << r;
            c = c->nextConnectionList.loadRelaxed();
        }
    }
    return returnValue;
}